

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_path_arc_to
               (nk_draw_list *list,nk_vec2 center,float radius,float a_min,float a_max,uint segments
               )

{
  nk_vec2 pos;
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_38;
  float fStack_34;
  
  if (list != (nk_draw_list *)0x0) {
    if ((radius != 0.0) || (NAN(radius))) {
      fVar6 = (a_max - a_min) / (float)segments;
      fVar3 = (((((((fVar6 * -1.8776444e-05 + 0.00047196605) * fVar6 + -0.0038510875) * fVar6 +
                  0.0073726485) * fVar6 + 0.028668385) * fVar6 + 0.012942246) * fVar6 + -0.50648546)
               * fVar6 + 0.0012548995) * fVar6 + 0.99996;
      local_38 = center.x;
      fStack_34 = center.y;
      fVar6 = ((((((fVar6 * 0.00013823564 + -0.0030399605) * fVar6 + 0.02080266) * fVar6 +
                 -0.02673534) * fVar6 + -0.13807878) * fVar6 + -0.012127613) * fVar6 + 1.0008676) *
              fVar6 + 1.910593e-31;
      fVar5 = ((((((((a_min * -1.8776444e-05 + 0.00047196605) * a_min + -0.0038510875) * a_min +
                   0.0073726485) * a_min + 0.028668385) * a_min + 0.012942246) * a_min + -0.50648546
                ) * a_min + 0.0012548995) * a_min + 0.99996) * radius;
      fVar4 = (((((((a_min * 0.00013823564 + -0.0030399605) * a_min + 0.02080266) * a_min +
                  -0.02673534) * a_min + -0.13807878) * a_min + -0.012127613) * a_min + 1.0008676) *
               a_min + 1.910593e-31) * radius;
      uVar1 = 0;
      do {
        pos.y = fStack_34 + fVar4;
        pos.x = local_38 + fVar5;
        nk_draw_list_path_line_to(list,pos);
        fVar2 = fVar6 * fVar5;
        fVar5 = fVar5 * fVar3 - fVar6 * fVar4;
        fVar4 = fVar4 * fVar3 + fVar2;
        uVar1 = uVar1 + 1;
      } while (uVar1 <= segments);
    }
    return;
  }
  __assert_fail("list",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x2733,
                "void nk_draw_list_path_arc_to(struct nk_draw_list *, struct nk_vec2, float, float, float, unsigned int)"
               );
}

Assistant:

NK_API void
nk_draw_list_path_arc_to(struct nk_draw_list *list, struct nk_vec2 center,
    float radius, float a_min, float a_max, unsigned int segments)
{
    unsigned int i = 0;
    NK_ASSERT(list);
    if (!list) return;
    if (radius == 0.0f) return;

    /*  This algorithm for arc drawing relies on these two trigonometric identities[1]:
            sin(a + b) = sin(a) * cos(b) + cos(a) * sin(b)
            cos(a + b) = cos(a) * cos(b) - sin(a) * sin(b)

        Two coordinates (x, y) of a point on a circle centered on
        the origin can be written in polar form as:
            x = r * cos(a)
            y = r * sin(a)
        where r is the radius of the circle,
            a is the angle between (x, y) and the origin.

        This allows us to rotate the coordinates around the
        origin by an angle b using the following transformation:
            x' = r * cos(a + b) = x * cos(b) - y * sin(b)
            y' = r * sin(a + b) = y * cos(b) + x * sin(b)

        [1] https://en.wikipedia.org/wiki/List_of_trigonometric_identities#Angle_sum_and_difference_identities
    */
    {const float d_angle = (a_max - a_min) / (float)segments;
    const float sin_d = (float)NK_SIN(d_angle);
    const float cos_d = (float)NK_COS(d_angle);

    float cx = (float)NK_COS(a_min) * radius;
    float cy = (float)NK_SIN(a_min) * radius;
    for(i = 0; i <= segments; ++i) {
        float new_cx, new_cy;
        const float x = center.x + cx;
        const float y = center.y + cy;
        nk_draw_list_path_line_to(list, nk_vec2(x, y));

        new_cx = cx * cos_d - cy * sin_d;
        new_cy = cy * cos_d + cx * sin_d;
        cx = new_cx;
        cy = new_cy;
    }}
}